

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

value * __thiscall
mjs::string_object::internal_value(value *__return_storage_ptr__,string_object *this)

{
  string_value((string_object *)&stack0xffffffffffffffe0);
  value::value(__return_storage_ptr__,(string *)&stack0xffffffffffffffe0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value internal_value() const override {
        return value{string_value()};
    }